

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O0

void set_sgb_attr_block(Emulator *e,int x0,int y0,int x1,int y1,u8 pal)

{
  u8 *puVar1;
  u8 mask;
  u8 *byte;
  int index;
  int x;
  int y;
  u8 pal_local;
  int y1_local;
  int x1_local;
  int y0_local;
  int x0_local;
  Emulator *e_local;
  
  for (index = y0; byte._4_4_ = x0, index <= y1; index = index + 1) {
    for (; (int)byte._4_4_ <= x1; byte._4_4_ = byte._4_4_ + 1) {
      puVar1 = (e->state).sgb.attr_map + ((int)(index * 0x14 + byte._4_4_) >> 2);
      *puVar1 = *puVar1 & ((byte)(0xc0 >> (sbyte)((byte._4_4_ & 3) << 1)) ^ 0xff) |
                pal << (('\x03' - ((byte)byte._4_4_ & 3)) * '\x02' & 0x1f);
    }
  }
  return;
}

Assistant:

static void set_sgb_attr_block(Emulator* e, int x0, int y0, int x1, int y1,
                               u8 pal) {
  for (int y = y0; y <= y1; ++y) {
    for (int x = x0; x <= x1; ++x) {
      int index = y * 20 + x;
      u8 *byte = &SGB.attr_map[index >> 2];
      u8 mask = ~(0xc0 >> (2 * (x & 3)));
      *byte = (*byte & mask) | (pal << (2 * (3 - (x & 3))));
    }
  }
}